

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O1

bool peparse::readQword(bounded_buffer *b,uint32_t offset,uint64_t *out)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((b != (bounded_buffer *)0x0) && (offset < b->bufLen)) {
    uVar1 = *(ulong *)(b->buf + offset);
    uVar2 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
            (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
            (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    if (b->swapBytes == false) {
      uVar2 = uVar1;
    }
    *out = uVar2;
    return true;
  }
  return false;
}

Assistant:

bool readQword(bounded_buffer *b, std::uint32_t offset, std::uint64_t &out) {
  if (b == nullptr) {
    return false;
  }

  if (offset >= b->bufLen) {
    return false;
  }

  std::uint64_t *tmp = reinterpret_cast<std::uint64_t *>(b->buf + offset);
  if (b->swapBytes) {
    out = byteSwapUint64(*tmp);
  } else {
    out = *tmp;
  }

  return true;
}